

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

int Zyx_TestGetTruthTablePars(char *pFileName,word *pTruth,int *nVars,int *nLutSize,int *nNodes)

{
  byte *pbVar1;
  int iVar2;
  size_t sVar3;
  byte *__dest;
  byte bVar4;
  char *__s;
  byte *__nptr;
  
  sVar3 = strlen(pFileName);
  __dest = (byte *)malloc(sVar3 + 1);
  strcpy((char *)__dest,pFileName);
  bVar4 = *__dest;
  __nptr = __dest;
  while ((bVar4 != 0 && ((0xf5 < (byte)(bVar4 - 0x3a) || (0xf9 < (byte)((bVar4 & 0xdf) + 0xb9))))))
  {
    pbVar1 = __nptr + 1;
    __nptr = __nptr + 1;
    bVar4 = *pbVar1;
  }
  *__nptr = 0;
  sVar3 = strlen((char *)__dest);
  iVar2 = (int)sVar3;
  if (iVar2 < 0x10) {
    switch(iVar2) {
    case 1:
      iVar2 = 2;
      break;
    case 2:
      iVar2 = 3;
      break;
    default:
switchD_005a87f8_caseD_3:
      free(__dest);
      __s = "Invalid truth table size.";
      goto LAB_005a88d3;
    case 4:
      iVar2 = 4;
      break;
    case 8:
      iVar2 = 5;
    }
  }
  else if (iVar2 == 0x10) {
    iVar2 = 6;
  }
  else if (iVar2 == 0x20) {
    iVar2 = 7;
  }
  else {
    if (iVar2 != 0x40) goto switchD_005a87f8_caseD_3;
    iVar2 = 8;
  }
  *nVars = iVar2;
  Abc_TtReadHex(pTruth,(char *)__dest);
  *__nptr = bVar4;
  do {
    bVar4 = *__nptr;
    if (bVar4 == 0) break;
    __nptr = __nptr + 1;
  } while (bVar4 != 0x2d);
  if (*__nptr == 0) {
    free(__dest);
    __s = "Expecting \'-\' after truth table before LUT size.";
  }
  else {
    iVar2 = atoi((char *)__nptr);
    *nLutSize = iVar2;
    do {
      bVar4 = *__nptr;
      if (bVar4 == 0) break;
      __nptr = __nptr + 1;
    } while (bVar4 != 0x2d);
    if (*__nptr != 0) {
      iVar2 = atoi((char *)__nptr);
      *nNodes = iVar2;
      free(__dest);
      return 1;
    }
    free(__dest);
    __s = "Expecting \'-\' after LUT size before node count.";
  }
LAB_005a88d3:
  puts(__s);
  return 0;
}

Assistant:

int Zyx_TestGetTruthTablePars( char * pFileName, word * pTruth, int * nVars, int * nLutSize, int * nNodes )
{
    char Symb, * pCur, * pBuffer = Abc_UtilStrsav( pFileName );
    int nLength;
    for ( pCur = pBuffer; *pCur; pCur++ )
        if ( !Abc_TtIsHexDigit(*pCur) )
            break;
    Symb = *pCur; *pCur = 0;
    nLength = (int)strlen(pBuffer);
    if ( nLength == 1 )
        *nVars = 2;
    else if ( nLength == 2 )
        *nVars = 3;
    else if ( nLength == 4 )
        *nVars = 4;
    else if ( nLength == 8 )
        *nVars = 5;
    else if ( nLength == 16 )
        *nVars = 6;
    else if ( nLength == 32 )
        *nVars = 7;
    else if ( nLength == 64 )
        *nVars = 8;
    else
    {
        ABC_FREE( pBuffer );
        printf( "Invalid truth table size.\n" );
        return 0;
    }
    Abc_TtReadHex( pTruth, pBuffer );
    *pCur = Symb;
    // read LUT size
    while ( *pCur && *pCur++ != '-' );
    if ( *pCur == 0 )
    {
        ABC_FREE( pBuffer );
        printf( "Expecting \'-\' after truth table before LUT size.\n" );
        return 0;
    }
    // read node count
    *nLutSize = atoi(pCur);
    while ( *pCur && *pCur++ != '-' );
    if ( *pCur == 0 )
    {
        ABC_FREE( pBuffer );
        printf( "Expecting \'-\' after LUT size before node count.\n" );
        return 0;
    }
    *nNodes = atoi(pCur);
    ABC_FREE( pBuffer );
    return 1;
}